

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinImporter::ReadBinaryBone(AssbinImporter *this,IOStream *stream,aiBone *b)

{
  uint uVar1;
  aiVertexWeight *out;
  runtime_error *this_00;
  ulong uVar2;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 == 0x123a) {
    Read<unsigned_int>(stream);
    Read<aiString>((aiString *)local_438,stream);
    if ((aiBone *)local_438 != b) {
      uVar2 = (ulong)local_438 & 0xffffffff;
      (b->mName).length = local_438._0_4_;
      memcpy((b->mName).data,local_438 + 4,uVar2);
      (b->mName).data[uVar2] = '\0';
    }
    uVar1 = Read<unsigned_int>(stream);
    b->mNumWeights = uVar1;
    Read<aiMatrix4x4t<float>>((aiMatrix4x4 *)local_438,stream);
    (b->mOffsetMatrix).d1 = local_408;
    (b->mOffsetMatrix).d2 = fStack_404;
    (b->mOffsetMatrix).d3 = fStack_400;
    (b->mOffsetMatrix).d4 = fStack_3fc;
    (b->mOffsetMatrix).c1 = local_418;
    (b->mOffsetMatrix).c2 = fStack_414;
    (b->mOffsetMatrix).c3 = fStack_410;
    (b->mOffsetMatrix).c4 = fStack_40c;
    (b->mOffsetMatrix).b1 = local_428;
    (b->mOffsetMatrix).b2 = fStack_424;
    (b->mOffsetMatrix).b3 = fStack_420;
    (b->mOffsetMatrix).b4 = fStack_41c;
    (b->mOffsetMatrix).a1 = (float)local_438._0_4_;
    (b->mOffsetMatrix).a2 = (float)local_438._4_4_;
    (b->mOffsetMatrix).a3 = fStack_430;
    (b->mOffsetMatrix).a4 = fStack_42c;
    uVar1 = b->mNumWeights;
    uVar2 = (ulong)uVar1 * 8;
    if (this->shortened == true) {
      (*stream->_vptr_IOStream[4])(stream,uVar2,1);
    }
    else {
      out = (aiVertexWeight *)operator_new__(uVar2);
      if (uVar1 != 0) {
        memset(out,0,uVar2);
      }
      b->mWeights = out;
      ReadArray<aiVertexWeight>(stream,out,uVar1);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_438 = (undefined1  [8])&local_428;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_438,"Magic chunk identifiers are wrong!","");
  std::runtime_error::runtime_error(this_00,(string *)local_438);
  *(undefined ***)this_00 = &PTR__runtime_error_008dc448;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryBone( IOStream * stream, aiBone* b ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIBONE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    b->mName = Read<aiString>(stream);
    b->mNumWeights = Read<unsigned int>(stream);
    b->mOffsetMatrix = Read<aiMatrix4x4>(stream);

    // for the moment we write dumb min/max values for the bones, too.
    // maybe I'll add a better, hash-like solution later
    if (shortened) {
        ReadBounds(stream,b->mWeights,b->mNumWeights);
    } else {
        // else write as usual
        b->mWeights = new aiVertexWeight[b->mNumWeights];
        ReadArray<aiVertexWeight>(stream,b->mWeights,b->mNumWeights);
    }
}